

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_run_optimize(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  uint64_t i;
  uint64_t val;
  
  r = roaring64_bitmap_create();
  roaring64_bitmap_add(r,20000);
  _Var1 = roaring64_bitmap_run_optimize(r);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_run_optimize(r)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x37c);
  assert_r64_valid((roaring64_bitmap_t *)r);
  val = 0;
  do {
    roaring64_bitmap_add(r,val);
    val = val + 1;
  } while (val != 30000);
  _Var1 = roaring64_bitmap_run_optimize(r);
  _assert_true((ulong)_Var1,"roaring64_bitmap_run_optimize(r)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x382);
  assert_r64_valid((roaring64_bitmap_t *)r);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_run_optimize) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    roaring64_bitmap_add(r, 20000);
    assert_false(roaring64_bitmap_run_optimize(r));
    assert_r64_valid(r);

    for (uint64_t i = 0; i < 30000; ++i) {
        roaring64_bitmap_add(r, i);
    }
    assert_true(roaring64_bitmap_run_optimize(r));
    assert_r64_valid(r);

    roaring64_bitmap_free(r);
}